

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

RepeatedField<unsigned_long> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  protobuf::internal::ShortSooRep::ShortSooRep((ShortSooRep *)ptr,*args);
  if ((*ptr & 4) != 0) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)ptr);
  }
  return (RepeatedField<unsigned_long> *)ptr;
}

Assistant:

static T* PROTOBUF_NONNULL Construct(void* PROTOBUF_NONNULL ptr,
                                         Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }